

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  byte bVar1;
  sqlite3_index_constraint_usage *psVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  uchar *puVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  undefined1 uVar12;
  char zIdxStr [41];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined1 uStack_30;
  undefined7 local_2f;
  undefined1 uStack_28;
  undefined8 uStack_27;
  
  uStack_28 = 0;
  uStack_27 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  local_2f = 0;
  local_48 = 0;
  uStack_40 = 0;
  uVar4 = (ulong)pIdxInfo->nConstraint;
  if (0 < (long)uVar4) {
    lVar11 = 0;
    bVar3 = false;
    do {
      if ((&pIdxInfo->aConstraint->op)[lVar11] == '@') {
        bVar3 = true;
      }
      lVar11 = lVar11 + 0xc;
    } while (uVar4 * 0xc != lVar11);
    if (0 < pIdxInfo->nConstraint) {
      puVar8 = &pIdxInfo->aConstraint->usable;
      uVar6 = 0;
      iVar7 = 0;
      do {
        if (bVar3) {
          if (*puVar8 != '\0') {
LAB_001c9840:
            uVar10 = ((sqlite3_index_constraint *)(puVar8 + -5))->iColumn;
LAB_001c9855:
            if (((int)uVar10 < 1) || ((byte)tab[1].field_0xd < uVar10)) {
              if (puVar8[-1] != '@') goto LAB_001c989b;
LAB_001c9869:
              uVar12 = 0x46;
            }
            else {
              bVar1 = puVar8[-1];
              if (bVar1 < 0x10) {
                if (bVar1 == 2) {
                  uVar12 = 0x41;
                }
                else if (bVar1 == 4) {
                  uVar12 = 0x45;
                }
                else {
                  if (bVar1 != 8) goto LAB_001c989b;
                  uVar12 = 0x42;
                }
              }
              else if (bVar1 == 0x10) {
                uVar12 = 0x43;
              }
              else {
                if (bVar1 != 0x20) {
                  if (bVar1 == 0x40) goto LAB_001c9869;
                  goto LAB_001c989b;
                }
                uVar12 = 0x44;
              }
            }
            *(undefined1 *)((long)&local_48 + (long)iVar7) = uVar12;
            *(char *)((long)&local_48 + (long)iVar7 + 1) = (char)uVar10 + '/';
            psVar2 = pIdxInfo->aConstraintUsage;
            psVar2[uVar6].argvIndex = (iVar7 - (iVar7 + 2 >> 0x1f)) + 2 >> 1;
            psVar2[uVar6].omit = '\x01';
            iVar7 = iVar7 + 2;
          }
        }
        else if (*puVar8 != '\0') {
          uVar10 = ((sqlite3_index_constraint *)(puVar8 + -5))->iColumn;
          if (uVar10 == 0) {
            if (puVar8[-1] == '\x02') {
              psVar2 = pIdxInfo->aConstraintUsage;
              uVar9 = 0;
              uVar4 = uVar9;
              if (uVar6 != 0) {
                do {
                  psVar2[uVar9].argvIndex = 0;
                  psVar2[uVar9].omit = '\0';
                  uVar9 = uVar9 + 1;
                  uVar4 = uVar6;
                } while (uVar6 != uVar9);
              }
              pIdxInfo->idxNum = 1;
              psVar2[uVar6].argvIndex = 1;
              psVar2[uVar4].omit = '\x01';
              pIdxInfo->estimatedCost = 30.0;
              pIdxInfo->estimatedRows = 1;
              pIdxInfo->idxFlags = 1;
              return 0;
            }
            goto LAB_001c9840;
          }
          goto LAB_001c9855;
        }
LAB_001c989b:
        uVar6 = uVar6 + 1;
      } while ((uVar6 < uVar4) && (puVar8 = puVar8 + 0xc, iVar7 < 0x28));
      pIdxInfo->idxNum = 2;
      pIdxInfo->needToFreeIdxStr = 1;
      if (0 < iVar7) {
        pcVar5 = sqlite3_mprintf("%s",&local_48);
        pIdxInfo->idxStr = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return 7;
        }
      }
      goto LAB_001c992a;
    }
  }
  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  iVar7 = 0;
LAB_001c992a:
  lVar11 = (long)tab[3].pModule >> ((byte)((uint)(iVar7 - (iVar7 >> 0x1f)) >> 1) & 0x3f);
  pIdxInfo->estimatedCost = (double)lVar11 * 6.0;
  pIdxInfo->estimatedRows = lVar11;
  return 0;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable 
     && p->iColumn==0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ 
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be 
      ** considered almost as quick as a direct rowid lookup (for which 
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */ 
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = 1;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 && 0==(pIdxInfo->idxStr = sqlite3_mprintf("%s", zIdxStr)) ){
    return SQLITE_NOMEM;
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}